

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O1

message * __thiscall booster::log::message::operator=(message *this,message *other)

{
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  
  if (this != other) {
    this->level_ = other->level_;
    uVar3 = *(undefined4 *)((long)&other->module_ + 4);
    uVar4 = *(undefined4 *)&other->file_name_;
    uVar5 = *(undefined4 *)((long)&other->file_name_ + 4);
    *(undefined4 *)&this->module_ = *(undefined4 *)&other->module_;
    *(undefined4 *)((long)&this->module_ + 4) = uVar3;
    *(undefined4 *)&this->file_name_ = uVar4;
    *(undefined4 *)((long)&this->file_name_ + 4) = uVar5;
    this->file_line_ = other->file_line_;
    pbVar1 = (other->message_)._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
    (other->message_)._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl = (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    pbVar2 = (this->message_)._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
    (this->message_)._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl = pbVar1;
    if (pbVar2 != (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)pbVar2 + 8))();
    }
  }
  return this;
}

Assistant:

message &message::operator=(message &&other) 
	{
		if(this!=&other) {
			level_ = other.level_;
			module_ = other.module_;
			file_name_=other.file_name_;
			file_line_=other.file_line_;
			message_=std::move(other.message_);
		}
		return *this;
	}